

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O3

void amrex::anon_unknown_1::MLNodeLinOp_set_dot_mask
               (MultiFab *dot_mask,iMultiFab *omask,Geometry *geom,
               GpuArray<amrex::LinOpBCType,_3U> *lobc,GpuArray<amrex::LinOpBCType,_3U> *hibc,
               CoarseningStrategy strategy)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int i;
  long lVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  double *pdVar15;
  long lVar16;
  double *pdVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  Box bx;
  MFIter mfi;
  long local_1d8;
  Array4<double> local_1a8;
  undefined8 local_168;
  int local_160;
  int local_15c [5];
  FabArray<amrex::FArrayBox> *local_148;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  GpuArray<amrex::LinOpBCType,_3U> *local_120;
  FabArray<amrex::IArrayBox> *local_118;
  GpuArray<amrex::LinOpBCType,_3U> *local_110;
  long local_108;
  long local_100;
  long local_f8;
  Box local_ec;
  Array4<const_int> local_d0;
  MFIter local_90;
  
  local_168 = *(undefined8 *)(geom->domain).smallend.vect;
  uVar1 = *(undefined8 *)((geom->domain).smallend.vect + 2);
  uVar2 = *(undefined8 *)((geom->domain).bigend.vect + 2);
  local_15c[1] = (int)((ulong)*(undefined8 *)(geom->domain).bigend.vect >> 0x20);
  local_15c[2] = (int)uVar2;
  local_15c[3] = (int)((ulong)uVar2 >> 0x20);
  local_160 = (int)uVar1;
  local_15c[0] = (int)((ulong)uVar1 >> 0x20);
  lVar9 = 0;
  do {
    if (((uint)local_15c[3] >> ((uint)lVar9 & 0x1f) & 1) == 0) {
      local_15c[lVar9] = local_15c[lVar9] + 1;
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  if (strategy != Sigma) {
    local_168._4_4_ = (int)((ulong)local_168 >> 0x20);
    local_160 = local_160 + -1000;
    local_15c[0] = local_15c[0] + 1000;
    local_168 = CONCAT44(local_168._4_4_ + -1000,(int)local_168 + -1000);
    local_15c[1] = local_15c[1] + 1000;
    local_15c[2] = local_15c[2] + 1000;
  }
  local_148 = &dot_mask->super_FabArray<amrex::FArrayBox>;
  local_118 = &omask->super_FabArray<amrex::IArrayBox>;
  local_110 = lobc;
  MFIter::MFIter(&local_90,(FabArrayBase *)dot_mask,true);
  iVar8 = local_15c[2];
  iVar7 = local_15c[1];
  iVar6 = local_160;
  if (local_90.currentIndex < local_90.endIndex) {
    iVar5 = local_168._4_4_;
    local_128 = (long)local_15c[0];
    local_130 = (long)(int)local_168;
    local_138 = local_130 << 3;
    local_140 = local_128 << 3;
    local_120 = hibc;
    do {
      MFIter::tilebox(&local_ec,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_1a8,local_148,&local_90);
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>(&local_d0,local_118,&local_90);
      auVar4 = _DAT_0065b9b0;
      auVar3 = _DAT_0065b9a0;
      lVar9 = (long)local_ec.smallend.vect[0];
      local_1d8 = (long)local_ec.smallend.vect[1];
      if (local_ec.smallend.vect[2] <= local_ec.bigend.vect[2]) {
        uVar10 = local_ec.bigend.vect[0] - local_ec.smallend.vect[0];
        auVar24._4_4_ = 0;
        auVar24._0_4_ = uVar10;
        auVar24._8_4_ = uVar10;
        auVar24._12_4_ = 0;
        local_100 = lVar9 * 4;
        local_108 = lVar9 * 8;
        iVar13 = local_ec.smallend.vect[2];
        do {
          if (local_ec.smallend.vect[1] <= local_ec.bigend.vect[1]) {
            local_f8 = (long)local_1a8.begin.z;
            lVar12 = (long)local_d0.p +
                     (local_1d8 - local_d0.begin.y) * local_d0.jstride * 4 +
                     ((long)iVar13 - (long)local_d0.begin.z) * local_d0.kstride * 4 +
                     (long)local_d0.begin.x * -4 + local_100 + 4;
            lVar16 = (long)local_1a8.p +
                     (local_1d8 - local_1a8.begin.y) * local_1a8.jstride * 8 +
                     (iVar13 - local_f8) * local_1a8.kstride * 8 + (long)local_1a8.begin.x * -8 +
                     local_108 + 8;
            lVar11 = local_1d8;
            do {
              if (local_ec.smallend.vect[0] <= local_ec.bigend.vect[0]) {
                uVar14 = 0;
                do {
                  auVar22._8_4_ = (int)uVar14;
                  auVar22._0_8_ = uVar14;
                  auVar22._12_4_ = (int)(uVar14 >> 0x20);
                  auVar28 = auVar24 ^ auVar4;
                  auVar22 = (auVar22 | auVar3) ^ auVar4;
                  if ((bool)(~(auVar22._4_4_ == auVar28._4_4_ && auVar28._0_4_ < auVar22._0_4_ ||
                              auVar28._4_4_ < auVar22._4_4_) & 1)) {
                    *(double *)(lVar16 + -8 + uVar14 * 8) =
                         (double)*(int *)(lVar12 + -4 + uVar14 * 4);
                  }
                  if (auVar22._12_4_ <= auVar28._12_4_ &&
                      (auVar22._12_4_ != auVar28._12_4_ || auVar22._8_4_ <= auVar28._8_4_)) {
                    *(double *)(lVar16 + uVar14 * 8) = (double)*(int *)(lVar12 + uVar14 * 4);
                  }
                  uVar14 = uVar14 + 2;
                } while (((ulong)uVar10 + 2 & 0x1fffffffe) != uVar14);
              }
              lVar11 = lVar11 + 1;
              lVar12 = lVar12 + local_d0.jstride * 4;
              lVar16 = lVar16 + local_1a8.jstride * 8;
            } while (local_ec.bigend.vect[1] + 1 != (int)lVar11);
          }
          bVar18 = iVar13 != local_ec.bigend.vect[2];
          iVar13 = iVar13 + 1;
        } while (bVar18);
      }
      lVar11 = (long)local_ec.smallend.vect[2];
      if (((local_110->arr[0] == Neumann) || (local_110->arr[0] == inflow)) &&
         (local_ec.smallend.vect[0] == (int)local_130 &&
          local_ec.smallend.vect[2] <= local_ec.bigend.vect[2])) {
        pdVar15 = (double *)
                  ((long)local_1a8.p +
                  (lVar11 - local_1a8.begin.z) * local_1a8.kstride * 8 +
                  (local_1d8 - local_1a8.begin.y) * local_1a8.jstride * 8 +
                  (long)local_1a8.begin.x * -8 + local_138);
        lVar12 = lVar11;
        do {
          pdVar17 = pdVar15;
          iVar13 = (local_ec.bigend.vect[1] - local_ec.smallend.vect[1]) + 1;
          if (local_ec.smallend.vect[1] <= local_ec.bigend.vect[1]) {
            do {
              *pdVar17 = *pdVar17 * 0.5;
              pdVar17 = pdVar17 + local_1a8.jstride;
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
          }
          lVar12 = lVar12 + 1;
          pdVar15 = pdVar15 + local_1a8.kstride;
        } while (local_ec.bigend.vect[2] + 1 != (int)lVar12);
      }
      if (((local_120->arr[0] == inflow) || (local_120->arr[0] == Neumann)) &&
         (local_ec.bigend.vect[0] == (int)local_128 &&
          local_ec.smallend.vect[2] <= local_ec.bigend.vect[2])) {
        pdVar15 = (double *)
                  ((long)local_1a8.p +
                  (lVar11 - local_1a8.begin.z) * local_1a8.kstride * 8 +
                  (local_1d8 - local_1a8.begin.y) * local_1a8.jstride * 8 +
                  (long)local_1a8.begin.x * -8 + local_140);
        lVar12 = lVar11;
        do {
          pdVar17 = pdVar15;
          iVar13 = (local_ec.bigend.vect[1] - local_ec.smallend.vect[1]) + 1;
          if (local_ec.smallend.vect[1] <= local_ec.bigend.vect[1]) {
            do {
              *pdVar17 = *pdVar17 * 0.5;
              pdVar17 = pdVar17 + local_1a8.jstride;
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
          }
          lVar12 = lVar12 + 1;
          pdVar15 = pdVar15 + local_1a8.kstride;
        } while (local_ec.bigend.vect[2] + 1 != (int)lVar12);
      }
      if (((local_110->arr[1] == inflow) || (local_110->arr[1] == Neumann)) &&
         (local_ec.smallend.vect[1] == iVar5 && local_ec.smallend.vect[2] <= local_ec.bigend.vect[2]
         )) {
        uVar10 = local_ec.bigend.vect[0] - local_ec.smallend.vect[0];
        auVar28._4_4_ = 0;
        auVar28._0_4_ = uVar10;
        auVar28._8_4_ = uVar10;
        auVar28._12_4_ = 0;
        lVar16 = (long)local_1a8.p +
                 (lVar11 - local_1a8.begin.z) * local_1a8.kstride * 8 +
                 (iVar5 - local_1a8.begin.y) * local_1a8.jstride * 8 + lVar9 * 8 +
                 (long)local_1a8.begin.x * -8 + 8;
        auVar28 = auVar28 ^ auVar4;
        lVar12 = lVar11;
        do {
          if (local_ec.smallend.vect[0] <= local_ec.bigend.vect[0]) {
            uVar14 = 0;
            do {
              auVar23._8_4_ = (int)uVar14;
              auVar23._0_8_ = uVar14;
              auVar23._12_4_ = (int)(uVar14 >> 0x20);
              auVar24 = (auVar23 | auVar3) ^ auVar4;
              if ((bool)(~(auVar28._4_4_ < auVar24._4_4_ ||
                          auVar28._0_4_ < auVar24._0_4_ && auVar24._4_4_ == auVar28._4_4_) & 1)) {
                *(double *)(lVar16 + -8 + uVar14 * 8) = *(double *)(lVar16 + -8 + uVar14 * 8) * 0.5;
              }
              if (auVar24._12_4_ <= auVar28._12_4_ &&
                  (auVar24._8_4_ <= auVar28._8_4_ || auVar24._12_4_ != auVar28._12_4_)) {
                *(double *)(lVar16 + uVar14 * 8) = *(double *)(lVar16 + uVar14 * 8) * 0.5;
              }
              uVar14 = uVar14 + 2;
            } while (((ulong)uVar10 + 2 & 0x1fffffffe) != uVar14);
          }
          lVar12 = lVar12 + 1;
          lVar16 = lVar16 + local_1a8.kstride * 8;
        } while (local_ec.bigend.vect[2] + 1 != (int)lVar12);
      }
      if (((local_120->arr[1] == inflow) || (local_120->arr[1] == Neumann)) &&
         (local_ec.bigend.vect[1] == iVar7 && local_ec.smallend.vect[2] <= local_ec.bigend.vect[2]))
      {
        uVar10 = local_ec.bigend.vect[0] - local_ec.smallend.vect[0];
        auVar19._4_4_ = 0;
        auVar19._0_4_ = uVar10;
        auVar19._8_4_ = uVar10;
        auVar19._12_4_ = 0;
        lVar12 = (long)local_1a8.p +
                 (lVar11 - local_1a8.begin.z) * local_1a8.kstride * 8 +
                 (iVar7 - local_1a8.begin.y) * local_1a8.jstride * 8 + lVar9 * 8 +
                 (long)local_1a8.begin.x * -8 + 8;
        auVar19 = auVar19 ^ auVar4;
        do {
          if (local_ec.smallend.vect[0] <= local_ec.bigend.vect[0]) {
            uVar14 = 0;
            do {
              auVar25._8_4_ = (int)uVar14;
              auVar25._0_8_ = uVar14;
              auVar25._12_4_ = (int)(uVar14 >> 0x20);
              auVar24 = (auVar25 | auVar3) ^ auVar4;
              if ((bool)(~(auVar19._4_4_ < auVar24._4_4_ ||
                          auVar19._0_4_ < auVar24._0_4_ && auVar24._4_4_ == auVar19._4_4_) & 1)) {
                *(double *)(lVar12 + -8 + uVar14 * 8) = *(double *)(lVar12 + -8 + uVar14 * 8) * 0.5;
              }
              if (auVar24._12_4_ <= auVar19._12_4_ &&
                  (auVar24._8_4_ <= auVar19._8_4_ || auVar24._12_4_ != auVar19._12_4_)) {
                *(double *)(lVar12 + uVar14 * 8) = *(double *)(lVar12 + uVar14 * 8) * 0.5;
              }
              uVar14 = uVar14 + 2;
            } while (((ulong)uVar10 + 2 & 0x1fffffffe) != uVar14);
          }
          lVar11 = lVar11 + 1;
          lVar12 = lVar12 + local_1a8.kstride * 8;
        } while (local_ec.bigend.vect[2] + 1 != (int)lVar11);
      }
      if (local_110->arr[2] == Neumann) {
        bVar18 = local_ec.smallend.vect[2] == iVar6;
      }
      else {
        bVar18 = local_ec.smallend.vect[2] == iVar6 && local_110->arr[2] == inflow;
      }
      if (local_ec.smallend.vect[1] <= local_ec.bigend.vect[1] && bVar18) {
        iVar13 = local_ec.bigend.vect[1];
        if (local_ec.bigend.vect[1] < local_ec.smallend.vect[1]) {
          iVar13 = local_ec.smallend.vect[1];
        }
        uVar10 = local_ec.bigend.vect[0] - local_ec.smallend.vect[0];
        auVar20._4_4_ = 0;
        auVar20._0_4_ = uVar10;
        auVar20._8_4_ = uVar10;
        auVar20._12_4_ = 0;
        lVar12 = (long)local_1a8.p +
                 (local_1d8 - local_1a8.begin.y) * local_1a8.jstride * 8 +
                 (local_ec.smallend.vect[2] - local_1a8.begin.z) * local_1a8.kstride * 8 + lVar9 * 8
                 + (long)local_1a8.begin.x * -8 + 8;
        lVar11 = local_1d8;
        do {
          if (local_ec.smallend.vect[0] <= local_ec.bigend.vect[0]) {
            uVar14 = 0;
            do {
              auVar26._8_4_ = (int)uVar14;
              auVar26._0_8_ = uVar14;
              auVar26._12_4_ = (int)(uVar14 >> 0x20);
              auVar22 = auVar20 ^ auVar4;
              auVar24 = (auVar26 | auVar3) ^ auVar4;
              if ((bool)(~(auVar24._4_4_ == auVar22._4_4_ && auVar22._0_4_ < auVar24._0_4_ ||
                          auVar22._4_4_ < auVar24._4_4_) & 1)) {
                *(double *)(lVar12 + -8 + uVar14 * 8) = *(double *)(lVar12 + -8 + uVar14 * 8) * 0.5;
              }
              if (auVar24._12_4_ <= auVar22._12_4_ &&
                  (auVar24._12_4_ != auVar22._12_4_ || auVar24._8_4_ <= auVar22._8_4_)) {
                *(double *)(lVar12 + uVar14 * 8) = *(double *)(lVar12 + uVar14 * 8) * 0.5;
              }
              uVar14 = uVar14 + 2;
            } while (((ulong)uVar10 + 2 & 0x1fffffffe) != uVar14);
          }
          lVar11 = lVar11 + 1;
          lVar12 = lVar12 + local_1a8.jstride * 8;
        } while (iVar13 + 1 != (int)lVar11);
      }
      if (local_120->arr[2] == Neumann) {
        bVar18 = local_ec.bigend.vect[2] == iVar8;
      }
      else {
        bVar18 = local_ec.bigend.vect[2] == iVar8 && local_120->arr[2] == inflow;
      }
      if (local_ec.smallend.vect[1] <= local_ec.bigend.vect[1] && bVar18) {
        iVar13 = local_ec.bigend.vect[1];
        if (local_ec.bigend.vect[1] < local_ec.smallend.vect[1]) {
          iVar13 = local_ec.smallend.vect[1];
        }
        uVar10 = local_ec.bigend.vect[0] - local_ec.smallend.vect[0];
        auVar21._4_4_ = 0;
        auVar21._0_4_ = uVar10;
        auVar21._8_4_ = uVar10;
        auVar21._12_4_ = 0;
        lVar9 = (long)local_1a8.p +
                (local_1d8 - local_1a8.begin.y) * local_1a8.jstride * 8 +
                (local_ec.bigend.vect[2] - local_1a8.begin.z) * local_1a8.kstride * 8 + lVar9 * 8 +
                (long)local_1a8.begin.x * -8 + 8;
        do {
          if (local_ec.smallend.vect[0] <= local_ec.bigend.vect[0]) {
            uVar14 = 0;
            do {
              auVar27._8_4_ = (int)uVar14;
              auVar27._0_8_ = uVar14;
              auVar27._12_4_ = (int)(uVar14 >> 0x20);
              auVar22 = auVar21 ^ auVar4;
              auVar24 = (auVar27 | auVar3) ^ auVar4;
              if ((bool)(~(auVar24._4_4_ == auVar22._4_4_ && auVar22._0_4_ < auVar24._0_4_ ||
                          auVar22._4_4_ < auVar24._4_4_) & 1)) {
                *(double *)(lVar9 + -8 + uVar14 * 8) = *(double *)(lVar9 + -8 + uVar14 * 8) * 0.5;
              }
              if (auVar24._12_4_ <= auVar22._12_4_ &&
                  (auVar24._12_4_ != auVar22._12_4_ || auVar24._8_4_ <= auVar22._8_4_)) {
                *(double *)(lVar9 + uVar14 * 8) = *(double *)(lVar9 + uVar14 * 8) * 0.5;
              }
              uVar14 = uVar14 + 2;
            } while (((ulong)uVar10 + 2 & 0x1fffffffe) != uVar14);
          }
          local_1d8 = local_1d8 + 1;
          lVar9 = lVar9 + local_1a8.jstride * 8;
        } while (iVar13 + 1 != (int)local_1d8);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void MLNodeLinOp_set_dot_mask (MultiFab& dot_mask, iMultiFab const& omask, Geometry const& geom,
                               GpuArray<LinOpBCType,AMREX_SPACEDIM> const& lobc,
                               GpuArray<LinOpBCType,AMREX_SPACEDIM> const& hibc,
                               MLNodeLinOp::CoarseningStrategy strategy)
{
    Box nddomain = amrex::surroundingNodes(geom.Domain());

    if (strategy != MLNodeLinOp::CoarseningStrategy::Sigma) {
        nddomain.grow(1000); // hack to avoid masks being modified at Neuman boundary
    }

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(dot_mask,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<Real> const& dfab = dot_mask.array(mfi);
        Array4<int const> const& sfab = omask.const_array(mfi);
        AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bx, tbx,
        {
            mlndlap_set_dot_mask(tbx, dfab, sfab, nddomain, lobc, hibc);
        });
    }
}